

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_regex.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int result;
  regmatch_t matchers [8];
  regex_t regexp;
  char **argv_local;
  int argc_local;
  
  BEGIN_TESTING((_func_void *)0x0);
  cunit_start_test("main");
  iVar1 = regcomp((regex_t *)(matchers + 7),main::pattern,1);
  cunit_named_check(iVar1 == 0,"main",0x43,"Error while compiling pattern %s");
  iVar1 = regexec((regex_t *)(matchers + 7),main::test1,8,(regmatch_t *)&stack0xffffffffffffff68,0);
  cunit_named_check(iVar1 != 0,"main",0x47,"Pattern %s should not match %s",main::pattern,
                    main::test1);
  iVar1 = regexec((regex_t *)(matchers + 7),main::test2,8,(regmatch_t *)&stack0xffffffffffffff68,0);
  cunit_named_check(iVar1 == 0,"main",0x49,"Pattern %s should not match %s",main::pattern,
                    main::test2);
  cunit_end_test("main");
  regfree((regex_t *)(matchers + 7));
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int
main(int argc __attribute__((unused)), char **argv __attribute__((unused))) {
  static const char *pattern = "^a.*b$";
  static const char *test1 = "abc";
  static const char *test2 = "abbbcb";

  regex_t regexp;
  regmatch_t matchers[8];
  int result;

  BEGIN_TESTING(NULL);
  START_TEST();
  result = regcomp(&regexp, pattern, REG_EXTENDED);
  CHECK_TRUE(result == 0,
      "Error while compiling pattern %s", pattern);


  CHECK_TRUE (regexec(&regexp, test1, ARRAYSIZE(matchers), matchers, 0) != 0,
      "Pattern %s should not match %s", pattern, test1);
  CHECK_TRUE (regexec(&regexp, test2, ARRAYSIZE(matchers), matchers, 0) == 0,
      "Pattern %s should not match %s", pattern, test2);
  END_TEST();

  regfree(&regexp);

  return FINISH_TESTING();
}